

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

uint ** matrix_copy(uint **a,uint rows,uint cols)

{
  uint *puVar1;
  uint *puVar2;
  uint **ppuVar3;
  ulong uVar4;
  ulong uVar5;
  
  ppuVar3 = matrix_new(rows,cols);
  if (rows != 0) {
    uVar4 = 0;
    do {
      if (cols != 0) {
        puVar1 = a[uVar4];
        puVar2 = ppuVar3[uVar4];
        uVar5 = 0;
        do {
          puVar2[uVar5] = puVar1[uVar5];
          uVar5 = uVar5 + 1;
        } while (cols != uVar5);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != rows);
  }
  return ppuVar3;
}

Assistant:

uint32_t **matrix_copy(uint32_t **a, uint32_t rows, uint32_t cols)
{
    uint32_t **b = matrix_new(rows, cols);
    for (uint32_t i = 0; i < rows; i++)
        for (uint32_t j = 0; j < cols; j++)
            b[i][j] = a[i][j];
    return b;
}